

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

void Model<BaseUser>::readFromFile(string *filename)

{
  bool bVar1;
  _Ios_Openmode __a;
  long *plVar2;
  pair<int,_BaseUser> local_418;
  undefined1 local_320 [8];
  BaseUser object;
  string local_220 [8];
  fstream file;
  string *filename_local;
  
  std::fstream::fstream(local_220);
  __a = std::operator|(_S_in,_S_out);
  std::operator|(__a,_S_bin);
  std::fstream::open(local_220,(_Ios_Openmode)filename);
  BaseUser::BaseUser((BaseUser *)local_320);
  while( true ) {
    plVar2 = (long *)std::istream::read((char *)local_220,(long)local_320);
    bVar1 = std::ios::operator_cast_to_bool((ios *)((long)plVar2 + *(long *)(*plVar2 + -0x18)));
    if (!bVar1) break;
    std::pair<int,_BaseUser>::pair<int_&,_BaseUser_&,_true>
              (&local_418,(int *)&object,(BaseUser *)local_320);
    std::map<int,BaseUser,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>>::
    insert<std::pair<int,BaseUser>>
              ((map<int,BaseUser,std::less<int>,std::allocator<std::pair<int_const,BaseUser>>> *)
               &objectList,&local_418);
  }
  std::fstream::close();
  std::fstream::~fstream(local_220);
  return;
}

Assistant:

void Model<T>::readFromFile(const string &filename) {
    fstream file;
    file.open(filename, ios::in | ios::out | ios::binary);
    T object;
    while (file.read((char *) &object, sizeof(object))) {
        Model<T>::objectList.insert(pair<int, T>(object.id, object));
    }
    file.close();
}